

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcd.cpp
# Opt level: O2

ssize_t __thiscall GPIO::HitachiLCD::write(HitachiLCD *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  long lVar2;
  void *extraout_RDX;
  void *__buf_00;
  void *extraout_RDX_00;
  long lVar3;
  undefined4 in_register_00000034;
  long *plVar4;
  wstring *__range1;
  
  plVar4 = (long *)CONCAT44(in_register_00000034,__fd);
  std::recursive_mutex::lock(&this->recursivemutex);
  lVar1 = *plVar4;
  lVar2 = plVar4[1];
  __buf_00 = extraout_RDX;
  for (lVar3 = 0; lVar2 << 2 != lVar3; lVar3 = lVar3 + 4) {
    write(this,*(int *)(lVar1 + lVar3),__buf_00,__n);
    __buf_00 = extraout_RDX_00;
  }
  lVar1 = plVar4[1];
  pthread_mutex_unlock((pthread_mutex_t *)&this->recursivemutex);
  return lVar1;
}

Assistant:

std::size_t HitachiLCD::write(const std::wstring& ws)
{
    RecursiveLock rlock(recursivemutex);
    for (auto ch : ws) write(ch);
    return ws.size();
}